

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeamStatus.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::BeamStatus::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,BeamStatus *this)

{
  ostream *poVar1;
  KINT32 Value;
  KStringStream ss;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Beam State:  ");
  ENUMS::GetEnumAsStringBeamState_abi_cxx11_
            (&local_1c0,(ENUMS *)(ulong)(this->m_ui8BeamStatus & 1),Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"Padding:     ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui8BeamStatus & 0xfffe);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString BeamStatus::GetAsString() const
{
    KStringStream ss;

    ss << "Beam State:  " << GetEnumAsStringBeamState(m_ui8BeamStatus & s_BeamStateBitmask)  << endl
       << "Padding:     " << static_cast<KUINT16>(m_ui8BeamStatus & s_PaddingBitmask)        << endl;

    return ss.str();
}